

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_prot.c
# Opt level: O0

_Bool xdr_rpcb(XDR *xdrs,RPCB *objp)

{
  _Bool _Var1;
  uint uVar2;
  RPCB *objp_local;
  XDR *xdrs_local;
  
  _Var1 = xdr_u_int32_t(xdrs,&objp->r_prog);
  if (_Var1) {
    _Var1 = xdr_u_int32_t(xdrs,&objp->r_vers);
    if (_Var1) {
      uVar2 = xdr_string((XDR *)xdrs,&objp->r_netid,0xffffffff);
      if ((uVar2 & 1) == 0) {
        xdrs_local._7_1_ = false;
      }
      else {
        uVar2 = xdr_string((XDR *)xdrs,&objp->r_addr,0xffffffff);
        if ((uVar2 & 1) == 0) {
          xdrs_local._7_1_ = false;
        }
        else {
          uVar2 = xdr_string((XDR *)xdrs,&objp->r_owner,0xffffffff);
          if ((uVar2 & 1) == 0) {
            xdrs_local._7_1_ = false;
          }
          else {
            xdrs_local._7_1_ = true;
          }
        }
      }
    }
    else {
      xdrs_local._7_1_ = false;
    }
  }
  else {
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

bool
xdr_rpcb(XDR *xdrs, RPCB *objp)
{
	if (!xdr_u_int32_t(xdrs, &objp->r_prog))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->r_vers))
		return (false);
	if (!xdr_string(xdrs, &objp->r_netid, (u_int) ~ 0))
		return (false);
	if (!xdr_string(xdrs, &objp->r_addr, (u_int) ~ 0))
		return (false);
	if (!xdr_string(xdrs, &objp->r_owner, (u_int) ~ 0))
		return (false);
	return (true);
}